

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_calculator.cpp
# Opt level: O1

void __thiscall ON_ArithmeticCalculator::ClearAll(ON_ArithmeticCalculator *this)

{
  ON_ArithmeticCalculatorImplementation *pOVar1;
  
  pOVar1 = this->m_pCalc;
  if (pOVar1 != (ON_ArithmeticCalculatorImplementation *)0x0) {
    pOVar1->m_op_stack_pointer = 0;
    pOVar1->m_expression_depth = 0;
    pOVar1->m_op_stack[0].m_x = 0.0;
    pOVar1->m_op_stack[0].m_op = op_unset;
    pOVar1->m_op_stack[0].m_level = 0;
    pOVar1 = this->m_pCalc;
    pOVar1->m_error_condition = '\0';
    pOVar1->m_bPendingImpliedMultiplication = '\0';
    pOVar1->m_bPendingUnaryPlus = '\0';
    pOVar1->m_bPendingUnaryMinus = '\0';
    pOVar1->m_bUnsetValue = '\0';
  }
  return;
}

Assistant:

void ON_ArithmeticCalculator::ClearAll()
{
  if ( m_pCalc )
  {
    // Do not clear configuration settings.
  
    // clear operation stack
    m_pCalc->ClearStack();
  
    // clear states
    m_pCalc->ClearStates();
  }
}